

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

void __thiscall QGridLayout::setColumnMinimumWidth(QGridLayout *this,int column,int minSize)

{
  QGridLayoutPrivate::setColumnMinimumWidth
            (*(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8,column,minSize);
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  return;
}

Assistant:

void QGridLayout::setColumnMinimumWidth(int column, int minSize)
{
    Q_D(QGridLayout);
    d->setColumnMinimumWidth(column, minSize);
    invalidate();
}